

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O1

Ref<embree::Image> __thiscall embree::loadTGA(embree *this,FileName *fileName)

{
  long lVar1;
  pointer pcVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  _Alloc_hider _Var8;
  ImageT<embree::Col4<float>_> *this_00;
  runtime_error *prVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  uchar v;
  Ref<embree::Image> *img;
  fstream file;
  string local_288;
  ulong local_260;
  ImageT<embree::Col4<float>_> *local_258;
  ulong local_250;
  Image *local_248;
  long local_240 [3];
  undefined4 auStack_224 [125];
  
  local_248 = (Image *)this;
  std::fstream::fstream(local_240);
  lVar1 = *(long *)(local_240[0] + -0x18);
  *(undefined4 *)((long)auStack_224 + lVar1) = 5;
  std::ios::clear((int)&local_288 + (int)lVar1 + 0x48);
  std::fstream::open((char *)local_240,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::istream::read((char *)local_240,(long)&local_288);
  if ((byte)local_288._M_dataplus._M_p != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_240,(long)&local_288);
  if ((byte)local_288._M_dataplus._M_p != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_240,(long)&local_288);
  if ((byte)local_288._M_dataplus._M_p != '\x02') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_240,(long)&local_288);
  sVar5 = (short)local_288._M_dataplus._M_p;
  std::istream::read((char *)local_240,(long)&local_288);
  sVar6 = (short)local_288._M_dataplus._M_p;
  std::istream::read((char *)local_240,(long)&local_288);
  cVar3 = (byte)local_288._M_dataplus._M_p;
  std::istream::read((char *)local_240,(long)&local_288);
  sVar7 = (short)local_288._M_dataplus._M_p;
  std::istream::read((char *)local_240,(long)&local_288);
  if ((cVar3 == '\0') &&
     ((sVar7 == 0 && (sVar6 == 0 && sVar5 == 0)) && (short)local_288._M_dataplus._M_p == 0)) {
    std::istream::read((char *)local_240,(long)&local_288);
    local_250 = (ulong)local_288._M_dataplus._M_p & 0xffff;
    std::istream::read((char *)local_240,(long)&local_288);
    local_260 = (ulong)local_288._M_dataplus._M_p & 0xffff;
    std::istream::read((char *)local_240,(long)&local_288);
    if ((byte)local_288._M_dataplus._M_p != '\x18') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"unsupported TGA file bits per pixel");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)local_240,(long)&local_288);
    if ((byte)local_288._M_dataplus._M_p == ' ') {
      this_00 = (ImageT<embree::Col4<float>_> *)operator_new(0x48);
      pcVar2 = (fileName->filename)._M_dataplus._M_p;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      local_258 = this_00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
      ImageT<embree::Col4<float>_>::ImageT(this_00,local_250,local_260,&local_288);
      (local_248->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
      (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if (local_260 != 0) {
        sVar11 = 0;
        do {
          if ((short)local_250 != 0) {
            sVar10 = 0;
            do {
              std::istream::read((char *)local_240,(long)&local_288);
              bVar4 = (byte)local_288._M_dataplus._M_p;
              std::istream::read((char *)local_240,(long)&local_288);
              _Var8._M_p = local_288._M_dataplus._M_p;
              std::istream::read((char *)local_240,(long)&local_288);
              auVar12._0_4_ = (float)(int)((ulong)_Var8._M_p & 0xff);
              auVar12._4_4_ = (float)bVar4;
              auVar12._8_8_ = 0;
              auVar12 = divps(auVar12,_DAT_00251f10);
              local_288._M_string_length._0_4_ = auVar12._4_4_;
              local_288._M_dataplus._M_p._4_4_ = auVar12._0_4_;
              local_288._M_dataplus._M_p._0_4_ = (float)(byte)local_288._M_dataplus._M_p / 255.0;
              local_288._M_string_length._4_4_ = 0x3f800000;
              (*(local_258->super_Image).super_RefCount._vptr_RefCount[5])
                        (local_258,sVar10,sVar11,&local_288);
              sVar10 = sVar10 + 1;
            } while (local_250 != sVar10);
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 != local_260);
      }
      std::fstream::~fstream(local_240);
      return (Ref<embree::Image>)local_248;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"unsupported TGA file");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadTGA(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    unsigned char idlength = fread_uchar(file);
    if (idlength != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char colormaptype = fread_uchar(file);
    if (colormaptype != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char datatype = fread_uchar(file);
    if (datatype != 2) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short cmo = fread_ushort(file);
    unsigned short cml = fread_ushort(file);
    unsigned char  cmd = fread_uchar(file);
    unsigned short xorg = fread_ushort(file);
    unsigned short yorg = fread_ushort(file);
    if (cmo != 0 || cml != 0 || cmd != 0 || xorg != 0 || yorg != 0)
      THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short width = fread_ushort(file);
    unsigned short height = fread_ushort(file);
    
    unsigned char bits = fread_uchar(file);
    if (bits != 3*8) THROW_RUNTIME_ERROR("unsupported TGA file bits per pixel");
    
    unsigned char desc = fread_uchar(file);
    if (desc != 0x20) THROW_RUNTIME_ERROR("unsupported TGA file");

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* load image data */
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        const unsigned char b = fread_uchar(file);
        const unsigned char g = fread_uchar(file);
        const unsigned char r = fread_uchar(file);
        img->set(x,y,Color4(r/255.0f,g/255.0f,b/255.0f,1.0f));
      }
    }

    return img;
  }